

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O0

word If_Dec6Truth(word z)

{
  uint uVar1;
  word wVar2;
  word local_58;
  int local_4c;
  int v;
  int i;
  word f [4];
  word q;
  word r;
  word z_local;
  
  if (z == 0) {
    __assert_fail("z",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                  ,0x7a,"word If_Dec6Truth(word)");
  }
  local_4c = 0;
  while( true ) {
    if (3 < local_4c) {
      wVar2 = If_Dec6ComposeLut4((uint)z & 0xffff,(word *)&v);
      for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
        uVar1 = (uint)(z >> ((char)(local_4c << 2) + 0x30U & 0x3f)) & 7;
        if (uVar1 != 6) {
          local_58 = wVar2;
          if (uVar1 != 7) {
            local_58 = Truth6[(int)uVar1];
          }
          *(word *)(&v + (long)local_4c * 2) = local_58;
        }
      }
      wVar2 = If_Dec6ComposeLut4((uint)(z >> 0x20) & 0xffff,(word *)&v);
      return wVar2;
    }
    uVar1 = (uint)(z >> ((char)(local_4c << 2) + 0x10U & 0x3f)) & 7;
    if (uVar1 == 7) break;
    if (uVar1 != 6) {
      *(word *)(&v + (long)local_4c * 2) = Truth6[(int)uVar1];
    }
    local_4c = local_4c + 1;
  }
  __assert_fail("v != 7",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                ,0x7e,"word If_Dec6Truth(word)");
}

Assistant:

word If_Dec6Truth( word z )
{
    word r, q, f[4];
    int i, v;
    assert( z );
    for ( i = 0; i < 4; i++ )
    {
        v = (z >> (16+(i<<2))) & 7;
        assert( v != 7 );
        if ( v == 6 )
            continue;
        f[i] = Truth6[v];
    }
    q = If_Dec6ComposeLut4( (int)(z & 0xffff), f );
    for ( i = 0; i < 4; i++ )
    {
        v = (z >> (48+(i<<2))) & 7;
        if ( v == 6 )
            continue;
        f[i] = (v == 7) ? q : Truth6[v];
    }
    r = If_Dec6ComposeLut4( (int)((z >> 32) & 0xffff), f );
    return r;
}